

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASBase.hpp
# Opt level: O0

Uint32 __thiscall
Diligent::BottomLevelASBase<Diligent::EngineVkImplTraits>::GetGeometryIndex
          (BottomLevelASBase<Diligent::EngineVkImplTraits> *this,char *Name)

{
  undefined *puVar1;
  bool bVar2;
  Char *pCVar3;
  pointer pvVar4;
  undefined8 uVar5;
  char (*in_R8) [49];
  undefined1 local_b1;
  undefined1 local_b0 [8];
  string _msg;
  string msg_1;
  HashMapStringKey local_68;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
  local_58;
  const_iterator iter;
  undefined1 local_40 [8];
  string msg;
  char *Name_local;
  BottomLevelASBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = Name;
  if ((Name == (char *)0x0) || (*Name == '\0')) {
    FormatString<char[32]>((string *)local_40,(char (*) [32])"Geometry name must not be empty");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"GetGeometryIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BottomLevelASBase.hpp"
               ,0x98);
    std::__cxx11::string::~string((string *)local_40);
  }
  HashMapStringKey::HashMapStringKey(&local_68,(Char *)msg.field_2._8_8_,false);
  local_58._M_cur =
       (__node_type *)
       std::
       unordered_map<Diligent::HashMapStringKey,_Diligent::BLASGeomIndex,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>_>
       ::find(&this->m_NameToIndex,&local_68);
  HashMapStringKey::~HashMapStringKey(&local_68);
  msg_1.field_2._8_8_ =
       std::
       unordered_map<Diligent::HashMapStringKey,_Diligent::BLASGeomIndex,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>_>
       ::end(&this->m_NameToIndex);
  bVar2 = std::__detail::operator!=
                    (&local_58,
                     (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
                      *)((long)&msg_1.field_2 + 8));
  if (bVar2) {
    pvVar4 = std::__detail::
             _Node_const_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false,_false>
                           *)&local_58);
    if ((pvVar4->second).ActualIndex == 0xffffffff) {
      FormatString<char[21],char_const*,char[49]>
                ((string *)((long)&_msg.field_2 + 8),(Diligent *)"Geometry with name \'",
                 (char (*) [21])((long)&msg.field_2 + 8),
                 (char **)"\', exists, but was not enabled in the last build",in_R8);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"GetGeometryIndex",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BottomLevelASBase.hpp"
                 ,0x9d);
      std::__cxx11::string::~string((string *)(_msg.field_2._M_local_buf + 8));
    }
    pvVar4 = std::__detail::
             _Node_const_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false,_false>
                           *)&local_58);
    this_local._4_4_ = (pvVar4->second).ActualIndex;
  }
  else {
    local_b1 = 0x27;
    FormatString<char[32],char_const*,char>
              ((string *)local_b0,(Diligent *)"Can\'t find geometry with name \'",
               (char (*) [32])((long)&msg.field_2 + 8),(char **)&local_b1,*in_R8);
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar5 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(2,uVar5,0);
    }
    std::__cxx11::string::~string((string *)local_b0);
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

GetGeometryIndex(const char* Name) const override final
    {
        DEV_CHECK_ERR(Name != nullptr && Name[0] != '\0', "Geometry name must not be empty");

        auto iter = m_NameToIndex.find(Name);
        if (iter != m_NameToIndex.end())
        {
            VERIFY(iter->second.ActualIndex != INVALID_INDEX, "Geometry with name '", Name, "', exists, but was not enabled in the last build");
            return iter->second.ActualIndex;
        }
        LOG_ERROR_MESSAGE("Can't find geometry with name '", Name, '\'');
        return INVALID_INDEX;
    }